

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O2

void uv__run_timers(uv_loop_t *loop)

{
  long *plVar1;
  long lVar2;
  long *local_28;
  long *local_20;
  
  local_28 = (long *)&local_28;
  local_20 = (long *)&local_28;
  while( true ) {
    plVar1 = (long *)(loop->timer_heap).min;
    if ((plVar1 == (long *)0x0) || (loop->time < (ulong)plVar1[3])) break;
    uv_timer_stop((uv_timer_t *)(plVar1 + -9));
    *plVar1 = (long)&local_28;
    plVar1[1] = (long)local_20;
    *local_20 = (long)plVar1;
    local_20 = plVar1;
  }
  while (plVar1 = local_28, (long **)local_28 != &local_28) {
    lVar2 = *local_28;
    *(long *)local_28[1] = lVar2;
    *(long *)(lVar2 + 8) = local_28[1];
    *local_28 = (long)local_28;
    plVar1[1] = (long)plVar1;
    uv_timer_again((uv_timer_t *)(plVar1 + -9));
    (*(code *)plVar1[-1])((uv_timer_t *)(plVar1 + -9));
  }
  return;
}

Assistant:

void uv__run_timers(uv_loop_t* loop) {
  struct heap_node* heap_node;
  uv_timer_t* handle;
  struct uv__queue* queue_node;
  struct uv__queue ready_queue;

  uv__queue_init(&ready_queue);

  for (;;) {
    heap_node = heap_min((struct heap*) &loop->timer_heap);
    if (heap_node == NULL)
      break;

    handle = container_of(heap_node, uv_timer_t, node.heap);
    if (handle->timeout > loop->time)
      break;

    uv_timer_stop(handle);
    uv__queue_insert_tail(&ready_queue, &handle->node.queue);
  }

  while (!uv__queue_empty(&ready_queue)) {
    queue_node = uv__queue_head(&ready_queue);
    uv__queue_remove(queue_node);
    uv__queue_init(queue_node);
    handle = container_of(queue_node, uv_timer_t, node.queue);

    uv_timer_again(handle);
    handle->timer_cb(handle);
  }
}